

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void arm_tr_insn_start(DisasContextBase *dcbase,CPUState *cpu)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGOp *pTVar1;
  TCGContext_conflict1 *tcg_ctx;
  DisasContextBase *__mptr;
  DisasContext_conflict1 *dc;
  CPUState *cpu_local;
  DisasContextBase *dcbase_local;
  
  tcg_ctx_00 = *(TCGContext_conflict1 **)(dcbase[8].pc_next + 0x2e8);
  tcg_gen_insn_start(tcg_ctx_00,dcbase->pc_next,
                     (long)(*(int *)((long)&dcbase[2].tb + 4) << 4 | *(int *)&dcbase[2].tb >> 1),0);
  pTVar1 = tcg_last_op(tcg_ctx_00);
  *(TCGOp **)&dcbase[4].max_insns = pTVar1;
  return;
}

Assistant:

static void arm_tr_insn_start(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    tcg_gen_insn_start(tcg_ctx, dc->base.pc_next,
                       (dc->condexec_cond << 4) | (dc->condexec_mask >> 1),
                       0);
    dc->insn_start = tcg_last_op(tcg_ctx);
}